

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::SignedConversionFunction::checkArguments
          (SignedConversionFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *this_00;
  bool bVar1;
  bitmask<slang::ast::IntegralFlags> bVar2;
  bitwidth_t width;
  Type *pTVar3;
  
  this_00 = ((context->scope).ptr)->compilation;
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (!bVar1) {
    return this_00->errorType;
  }
  pTVar3 = ((*args->_M_ptr)->type).ptr;
  bVar1 = Type::isIntegral(pTVar3);
  if (bVar1) {
    bVar2 = Type::getIntegralFlags(pTVar3);
    bVar1 = this->toSigned;
    width = Type::getBitWidth(pTVar3);
    pTVar3 = Compilation::getType
                       (this_00,width,(bitmask<slang::ast::IntegralFlags>)(bVar2.m_bits & 6 | bVar1)
                       );
    return pTVar3;
  }
  pTVar3 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,*args->_M_ptr);
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        auto& type = *args[0]->type;
        if (!type.isIntegral())
            return badArg(context, *args[0]);

        auto flags = type.getIntegralFlags() & ~IntegralFlags::Signed;
        if (toSigned)
            flags |= IntegralFlags::Signed;

        return comp.getType(type.getBitWidth(), flags);
    }